

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDD.cpp
# Opt level: O1

void __thiscall HDD::SetIdentifyData(HDD *this,IDENTIFYDEVICE *pIdentify_)

{
  ushort *puVar1;
  byte *pbVar2;
  pointer pcVar3;
  uint8_t uVar4;
  int iVar5;
  char *pb;
  long lVar6;
  size_t i;
  ulong uVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  HDD *this_00;
  HDD *this_01;
  string strDate;
  undefined1 local_58 [32];
  _Alloc_hider *local_38 [2];
  _Alloc_hider local_28 [2];
  
  this_00 = (HDD *)local_58;
  this_01 = (HDD *)local_58;
  if (pIdentify_ == (IDENTIFYDEVICE *)0x0) {
    CalculateGeometry(this->total_sectors,&this->cyls,&this->heads,&this->sectors);
    memset(&this->sIdentify,0,0x204);
    (this->sIdentify).len = 0x200;
    (this->sIdentify).field_1.word[0] = 0x40;
    iVar5 = this->heads;
    (this->sIdentify).field_1.word[1] = (uint16_t)this->cyls;
    (this->sIdentify).field_1.word[3] = (uint16_t)iVar5;
    (this->sIdentify).field_1.word[6] = (uint16_t)this->sectors;
    util::fmt_abi_cxx11_((string *)local_58,"%04u%02u%02u",0x7e9,4,0x1a);
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"");
    *(undefined4 *)((long)&(this->sIdentify).field_1 + 0x14) = 0x20202020;
    *(undefined4 *)((long)&(this->sIdentify).field_1 + 0x18) = 0x20202020;
    *(undefined4 *)((long)&(this->sIdentify).field_1 + 0x1c) = 0x20202020;
    *(undefined4 *)((long)&(this->sIdentify).field_1 + 0x20) = 0x20202020;
    *(undefined4 *)((long)&(this->sIdentify).field_1 + 0x24) = 0x20202020;
    uVar7 = 0;
    do {
      uVar4 = *(uint8_t *)((long)&local_38[0]->_M_p + uVar7);
      if (uVar4 == '\0') break;
      (this->sIdentify).field_1.byte[(uVar7 ^ 1) + 0x14] = uVar4;
      uVar7 = uVar7 + 1;
    } while (uVar7 != 0x14);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],(ulong)(local_28[0]._M_p + 1));
    }
    *(undefined8 *)((long)&(this->sIdentify).field_1 + 0x2e) = 0x2020202020202020;
    uVar7 = 0;
    do {
      if (*(uint8_t *)(local_58._0_8_ + uVar7) == '\0') break;
      (this->sIdentify).field_1.byte[(uVar7 ^ 1) + 0x2e] = *(uint8_t *)(local_58._0_8_ + uVar7);
      uVar7 = uVar7 + 1;
    } while (uVar7 != 8);
    pcVar10 = "SAMdisk Device";
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"SAMdisk Device","");
    *(undefined8 *)((long)&(this->sIdentify).field_1 + 0x56) = 0x2020202020202020;
    *(undefined8 *)((long)&(this->sIdentify).field_1 + 0x46) = 0x2020202020202020;
    *(undefined8 *)((long)&(this->sIdentify).field_1 + 0x4e) = 0x2020202020202020;
    *(undefined8 *)((long)&(this->sIdentify).field_1 + 0x36) = 0x2020202020202020;
    *(undefined8 *)((long)&(this->sIdentify).field_1 + 0x3e) = 0x2020202020202020;
    uVar7 = 0;
    do {
      uVar4 = *(uint8_t *)((long)&local_38[0]->_M_p + uVar7);
      pIdentify_ = (IDENTIFYDEVICE *)pcVar10;
      if (uVar4 == '\0') break;
      pcVar10 = (char *)(uVar7 ^ 1);
      ((this->sIdentify).field_1.byte + 0x36)[(long)pcVar10] = uVar4;
      uVar7 = uVar7 + 1;
      pIdentify_ = (IDENTIFYDEVICE *)pcVar10;
    } while (uVar7 != 0x28);
    if (local_38[0] != local_28) {
      pIdentify_ = (IDENTIFYDEVICE *)(local_28[0]._M_p + 1);
      operator_delete(local_38[0],(ulong)pIdentify_);
    }
    (this->sIdentify).field_1.word[0x2f] = 1;
    (this->sIdentify).field_1.word[0x31] = 0x200;
    (this->sIdentify).field_1.word[0x35] = 1;
    (this->sIdentify).field_1.word[0x36] = (this->sIdentify).field_1.word[1];
    (this->sIdentify).field_1.word[0x37] = (this->sIdentify).field_1.word[3];
    (this->sIdentify).field_1.word[0x38] = (this->sIdentify).field_1.word[6];
    lVar8 = this->total_sectors;
    lVar6 = this->total_bytes;
    lVar9 = 0xfbfc10;
    if (lVar8 < 0xfbfc10) {
      lVar9 = lVar8;
    }
    (this->sIdentify).field_1.word[0x39] = (uint16_t)lVar9;
    (this->sIdentify).field_1.word[0x3a] = (uint16_t)((ulong)lVar9 >> 0x10);
    lVar9 = 0xfffffff;
    if (lVar8 < 0xfffffff) {
      lVar9 = lVar8;
    }
    (this->sIdentify).field_1.word[0x3c] = (uint16_t)lVar9;
    (this->sIdentify).field_1.word[0x3d] = (uint16_t)((ulong)lVar9 >> 0x10);
    lVar6 = lVar6 / (long)this->sector_size;
    lVar8 = 0xffffffffffff;
    if (lVar6 < 0xffffffffffff) {
      lVar8 = lVar6;
    }
    (this->sIdentify).field_1.word[100] = (uint16_t)lVar8;
    (this->sIdentify).field_1.word[0x65] = (uint16_t)((ulong)lVar8 >> 0x10);
    (this->sIdentify).field_1.word[0x66] = (uint16_t)((ulong)lVar8 >> 0x20);
    (this->sIdentify).field_1.word[0x67] = 0;
    if (opt.nocfa == 0) {
      (this->sIdentify).field_1.word[0] = 0x848a;
      puVar1 = (this->sIdentify).field_1.word + 0x53;
      *puVar1 = *puVar1 | 0x4004;
      pbVar2 = (this->sIdentify).field_1.byte + 0xa9;
      *pbVar2 = *pbVar2 | 0x40;
      pbVar2 = (this->sIdentify).field_1.byte + 0xac;
      *pbVar2 = *pbVar2 | 4;
      pbVar2 = (this->sIdentify).field_1.byte + 0xaf;
      *pbVar2 = *pbVar2 | 0x40;
    }
    if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
      pIdentify_ = (IDENTIFYDEVICE *)(local_58._16_8_ + 1);
      operator_delete((void *)local_58._0_8_,(ulong)pIdentify_);
    }
  }
  else {
    memcpy(&this->sIdentify,pIdentify_,0x204);
    this->cyls = (uint)(this->sIdentify).field_1.word[1];
    this->heads = (uint)(this->sIdentify).field_1.word[3];
    this->sectors = (uint)(this->sIdentify).field_1.word[6];
    if (opt.noidentify != 0) {
      (this->sIdentify).len = 0;
    }
  }
  GetIdentifyString_abi_cxx11_
            ((string *)local_58,(HDD *)pIdentify_,(void *)((long)&(this->sIdentify).field_1 + 0x14),
             0x14);
  std::__cxx11::string::operator=((string *)&this->strSerialNumber,(string *)local_58);
  pcVar3 = local_58 + 0x10;
  if ((pointer)local_58._0_8_ != pcVar3) {
    this_00 = (HDD *)(local_58._16_8_ + 1);
    operator_delete((void *)local_58._0_8_,(ulong)this_00);
  }
  GetIdentifyString_abi_cxx11_
            ((string *)local_58,this_00,(void *)((long)&(this->sIdentify).field_1 + 0x2e),8);
  std::__cxx11::string::operator=((string *)&this->strFirmwareRevision,(string *)local_58);
  if ((pointer)local_58._0_8_ != pcVar3) {
    this_01 = (HDD *)(local_58._16_8_ + 1);
    operator_delete((void *)local_58._0_8_,(ulong)this_01);
  }
  GetIdentifyString_abi_cxx11_
            ((string *)local_58,this_01,(void *)((long)&(this->sIdentify).field_1 + 0x36),0x28);
  std::__cxx11::string::operator=((string *)&this->strMakeModel,(string *)local_58);
  if ((pointer)local_58._0_8_ != pcVar3) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  return;
}

Assistant:

void HDD::SetIdentifyData(const IDENTIFYDEVICE* pIdentify_)
{
    // Use any supplied identify data
    if (pIdentify_)
    {
        // Copy the supplied data
        memcpy(&sIdentify, pIdentify_, sizeof(sIdentify));

        // Update CHS from the identify data
        cyls = sIdentify.word[1];
        heads = sIdentify.word[3];
        sectors = sIdentify.word[6];

        // Invalidate the identify length if we're told to ignore it
        if (opt.noidentify)
            sIdentify.len = 0;
    }
    else
    {
        // Generate CHS values from the total sector count
        CalculateGeometry(total_sectors, cyls, heads, sectors);

        // Clear any existing data and set the full data size
        memset(&sIdentify, 0, sizeof(sIdentify));
        sIdentify.len = sizeof(sIdentify.byte);

        sIdentify.word[0] = (1 << 6);     // fixed device

        // CHS values
        sIdentify.word[1] = static_cast<uint16_t>(cyls);
        sIdentify.word[3] = static_cast<uint16_t>(heads);
        sIdentify.word[6] = static_cast<uint16_t>(sectors);

        // Form 8-character date string from SAMdisk build date, to use as firmware revision
        std::string strDate = util::fmt("%04u%02u%02u", YEAR, MONTH + 1, DAY);

        // Serial number, firmware revision and model number
        SetIdentifyString("", &sIdentify.word[10], 20);
        SetIdentifyString(strDate, &sIdentify.word[23], 8);
        SetIdentifyString("SAMdisk Device", &sIdentify.word[27], 40);

        sIdentify.word[47] = 1;                     // read/write multiple supports 1 sector blocks
        sIdentify.word[49] = (1 << 9);              // LBA supported

        // Current override CHS values
        sIdentify.word[53] = (1 << 0);              // words 54-58 are valid
        sIdentify.word[54] = sIdentify.word[1];     // current cyls
        sIdentify.word[55] = sIdentify.word[3];     // current heads
        sIdentify.word[56] = sIdentify.word[6];     // current sectors

        // Max CHS sector count is just C*H*S with maximum values for each
        auto uMaxSectorsCHS = 16383 * 16 * 63;
        auto uTotalSectorsCHS = (total_sectors > uMaxSectorsCHS) ? uMaxSectorsCHS : total_sectors;
        sIdentify.word[57] = static_cast<uint16_t>(uTotalSectorsCHS & 0xffff);
        sIdentify.word[58] = static_cast<uint16_t>((uTotalSectorsCHS >> 16) & 0xffff);

        // Max LBA28 sector count is 0x0fffffff
        auto uMaxSectorsLBA28 = (1 << 28) - 1;
        auto uTotalSectorsLBA28 = (total_sectors > uMaxSectorsLBA28) ? uMaxSectorsLBA28 : total_sectors;
        sIdentify.word[60] = uTotalSectorsLBA28 & 0xffff;
        sIdentify.word[61] = (uTotalSectorsLBA28 >> 16) & 0xffff;

        // Max LBA48 sector count is 0x0000ffffffffffff
        auto llTotalSectors = total_bytes / sector_size;
        auto llMaxSectorsLBA48 = (1LL << 48) - 1;
        auto llTotalSectorsLBA48 = (llTotalSectors > llMaxSectorsLBA48) ? llMaxSectorsLBA48 : llTotalSectors;
        sIdentify.word[100] = static_cast<uint16_t>(llTotalSectorsLBA48 & 0xffff);
        sIdentify.word[101] = static_cast<uint16_t>((llTotalSectorsLBA48 >> 16) & 0xffff);
        sIdentify.word[102] = static_cast<uint16_t>((llTotalSectorsLBA48 >> 32) & 0xffff);
        sIdentify.word[103] = 0;

        // If CFA ((CompactFlash Association) support isn't explicitly disabled, enable it
        if (!opt.nocfa)
        {
            sIdentify.word[0] = 0x848a;     // special value used to indicate CFA feature set support

            sIdentify.word[83] |= (1 << 2) | (1 << 14); // CFA feature set supported, feature bits are valid
            sIdentify.word[84] |= (1 << 14);            // indicate feature bits are valid
            sIdentify.word[86] |= (1 << 2);         // CFA feature set enabled
            sIdentify.word[87] |= (1 << 14);            // indicate features enabled are valid
        }
    }

    // Read the strings for serial number, firmware revision and make/model
    strSerialNumber = GetIdentifyString(&sIdentify.word[10], 20);
    strFirmwareRevision = GetIdentifyString(&sIdentify.word[23], 8);
    strMakeModel = GetIdentifyString(&sIdentify.word[27], 40);
}